

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O1

void helicsPublicationPublishNamedPoint(HelicsPublication pub,char *str,double val,HelicsError *err)

{
  Publication *this;
  undefined1 auVar1 [16];
  HelicsPublication pvVar2;
  size_t sVar3;
  string_view field;
  undefined1 local_30 [16];
  
  if ((err == (HelicsError *)0x0) || (err->error_code == 0)) {
    if (pub == (HelicsPublication)0x0) {
      if (err == (HelicsError *)0x0) goto LAB_001a8984;
    }
    else {
      pvVar2 = (HelicsPublication)0x0;
      if (*pub == -0x684eff5b) {
        pvVar2 = pub;
      }
      if (*pub == -0x684eff5b || err == (HelicsError *)0x0) goto LAB_001a8986;
    }
    err->error_code = -3;
    err->message = "The given publication object does not point to a valid object";
  }
LAB_001a8984:
  pvVar2 = (HelicsPublication)0x0;
LAB_001a8986:
  if (pvVar2 != (HelicsPublication)0x0) {
    this = *(Publication **)((long)pvVar2 + 0x18);
    if (str == (char *)0x0) {
      local_30[0] = 0;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = local_30;
      helics::Publication::publish(this,(string_view)(auVar1 << 0x40),val);
    }
    else {
      sVar3 = strlen(str);
      field._M_str = str;
      field._M_len = sVar3;
      helics::Publication::publish(this,field,val);
    }
  }
  return;
}

Assistant:

void helicsPublicationPublishNamedPoint(HelicsPublication pub, const char* str, double val, HelicsError* err)
{
    auto* pubObj = verifyPublication(pub, err);
    if (pubObj == nullptr) {
        return;
    }
    try {
        if (str == nullptr) {
            pubObj->pubPtr->publish(std::string(), val);
        } else {
            pubObj->pubPtr->publish(str, val);
        }
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}